

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsbox.cpp
# Opt level: O0

Error * libsbox::run_together
                  (Error *__return_storage_ptr__,
                  vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_> *tasks,
                  string *socket_path)

{
  Task *this;
  bool bVar1;
  byte bVar2;
  int iVar3;
  ParseErrorCode parseErrorCode;
  SizeType SVar4;
  reference ppTVar5;
  Ch *__s;
  char *pcVar6;
  unsigned_long *puVar7;
  void *__buf;
  long lVar8;
  ssize_t sVar9;
  Ch *str;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *this_00;
  size_t sVar10;
  Ch *pCVar11;
  size_type sVar12;
  const_reference ppTVar13;
  Type pGVar14;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *value;
  ulong local_770;
  size_t i;
  string local_760;
  undefined1 local_740 [8];
  string local_738;
  string local_718;
  string local_6f8;
  undefined1 local_6d8 [8];
  Document document;
  string local_658;
  string local_638;
  char local_618 [8];
  char buf [1024];
  string res;
  undefined1 local_1d0 [4];
  int cnt;
  int local_1ac;
  unsigned_long uStack_1a8;
  int status;
  unsigned_long local_1a0;
  undefined1 auStack_198 [8];
  sockaddr_un addr;
  shared_ptr<int> ptr;
  string local_110;
  int local_f0;
  allocator<char> local_e9;
  fd_t socket_fd;
  string message;
  Task *task;
  const_iterator __end1;
  const_iterator __begin1;
  vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_> *__range1;
  undefined1 local_90 [8];
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  writer;
  StringBuffer buffer;
  string *socket_path_local;
  vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_> *tasks_local;
  Error *error;
  
  rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  GenericStringBuffer((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                      &writer.maxDecimalPlaces_,(CrtAllocator *)0x0,0x100);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Writer((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
            *)local_90,
           (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
           &writer.maxDecimalPlaces_,(CrtAllocator *)0x0,0x20);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartObject((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                 *)local_90);
  __range1 = (vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_> *)anon_var_dwarf_1702c;
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
         *)local_90,(Ch **)&__range1);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                *)local_90);
  __end1 = std::vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>::begin(tasks);
  task = (Task *)std::vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>::end(tasks);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<libsbox::Task_*const_*,_std::vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>_>
                                     *)&task), bVar1) {
    ppTVar5 = __gnu_cxx::
              __normal_iterator<libsbox::Task_*const_*,_std::vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>_>
              ::operator*(&__end1);
    message.field_2._8_8_ = *ppTVar5;
    Task::
    serialize_request<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
              ((Task *)message.field_2._8_8_,
               (Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                *)local_90);
    __gnu_cxx::
    __normal_iterator<libsbox::Task_*const_*,_std::vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>_>
    ::operator++(&__end1);
  }
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *)local_90,0);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndObject((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
               *)local_90,0);
  __s = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                  ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                   &writer.maxDecimalPlaces_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&socket_fd,__s,&local_e9);
  std::allocator<char>::~allocator(&local_e9);
  local_f0 = socket(1,1,0);
  if (local_f0 < 0) {
    format_abi_cxx11_(&local_110,"Cannot create socket: %m");
    Error::Error(__return_storage_ptr__,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    goto LAB_001108eb;
  }
  std::shared_ptr<int>::
  shared_ptr<int,libsbox::run_together(std::vector<libsbox::Task*,std::allocator<libsbox::Task*>>const&,std::__cxx11::string_const&)::__0,void>
            ((shared_ptr<int> *)(addr.sun_path + 0x66),&local_f0);
  addr.sun_path[0x56] = '\0';
  addr.sun_path[0x57] = '\0';
  addr.sun_path[0x58] = '\0';
  addr.sun_path[0x59] = '\0';
  addr.sun_path[0x5a] = '\0';
  addr.sun_path[0x5b] = '\0';
  addr.sun_path[0x5c] = '\0';
  addr.sun_path[0x5d] = '\0';
  addr.sun_path[0x5e] = '\0';
  addr.sun_path[0x5f] = '\0';
  addr.sun_path[0x60] = '\0';
  addr.sun_path[0x61] = '\0';
  addr.sun_path[0x62] = '\0';
  addr.sun_path[99] = '\0';
  addr.sun_path[0x46] = '\0';
  addr.sun_path[0x47] = '\0';
  addr.sun_path[0x48] = '\0';
  addr.sun_path[0x49] = '\0';
  addr.sun_path[0x4a] = '\0';
  addr.sun_path[0x4b] = '\0';
  addr.sun_path[0x4c] = '\0';
  addr.sun_path[0x4d] = '\0';
  addr.sun_path[0x4e] = '\0';
  addr.sun_path[0x4f] = '\0';
  addr.sun_path[0x50] = '\0';
  addr.sun_path[0x51] = '\0';
  addr.sun_path[0x52] = '\0';
  addr.sun_path[0x53] = '\0';
  addr.sun_path[0x54] = '\0';
  addr.sun_path[0x55] = '\0';
  addr.sun_path[0x36] = '\0';
  addr.sun_path[0x37] = '\0';
  addr.sun_path[0x38] = '\0';
  addr.sun_path[0x39] = '\0';
  addr.sun_path[0x3a] = '\0';
  addr.sun_path[0x3b] = '\0';
  addr.sun_path[0x3c] = '\0';
  addr.sun_path[0x3d] = '\0';
  addr.sun_path[0x3e] = '\0';
  addr.sun_path[0x3f] = '\0';
  addr.sun_path[0x40] = '\0';
  addr.sun_path[0x41] = '\0';
  addr.sun_path[0x42] = '\0';
  addr.sun_path[0x43] = '\0';
  addr.sun_path[0x44] = '\0';
  addr.sun_path[0x45] = '\0';
  addr.sun_path[0x26] = '\0';
  addr.sun_path[0x27] = '\0';
  addr.sun_path[0x28] = '\0';
  addr.sun_path[0x29] = '\0';
  addr.sun_path[0x2a] = '\0';
  addr.sun_path[0x2b] = '\0';
  addr.sun_path[0x2c] = '\0';
  addr.sun_path[0x2d] = '\0';
  addr.sun_path[0x2e] = '\0';
  addr.sun_path[0x2f] = '\0';
  addr.sun_path[0x30] = '\0';
  addr.sun_path[0x31] = '\0';
  addr.sun_path[0x32] = '\0';
  addr.sun_path[0x33] = '\0';
  addr.sun_path[0x34] = '\0';
  addr.sun_path[0x35] = '\0';
  addr.sun_path[0x16] = '\0';
  addr.sun_path[0x17] = '\0';
  addr.sun_path[0x18] = '\0';
  addr.sun_path[0x19] = '\0';
  addr.sun_path[0x1a] = '\0';
  addr.sun_path[0x1b] = '\0';
  addr.sun_path[0x1c] = '\0';
  addr.sun_path[0x1d] = '\0';
  addr.sun_path[0x1e] = '\0';
  addr.sun_path[0x1f] = '\0';
  addr.sun_path[0x20] = '\0';
  addr.sun_path[0x21] = '\0';
  addr.sun_path[0x22] = '\0';
  addr.sun_path[0x23] = '\0';
  addr.sun_path[0x24] = '\0';
  addr.sun_path[0x25] = '\0';
  addr.sun_path[6] = '\0';
  addr.sun_path[7] = '\0';
  addr.sun_path[8] = '\0';
  addr.sun_path[9] = '\0';
  addr.sun_path[10] = '\0';
  addr.sun_path[0xb] = '\0';
  addr.sun_path[0xc] = '\0';
  addr.sun_path[0xd] = '\0';
  addr.sun_path[0xe] = '\0';
  addr.sun_path[0xf] = '\0';
  addr.sun_path[0x10] = '\0';
  addr.sun_path[0x11] = '\0';
  addr.sun_path[0x12] = '\0';
  addr.sun_path[0x13] = '\0';
  addr.sun_path[0x14] = '\0';
  addr.sun_path[0x15] = '\0';
  addr.sun_family = 0;
  addr.sun_path[0] = '\0';
  addr.sun_path[1] = '\0';
  addr.sun_path[2] = '\0';
  addr.sun_path[3] = '\0';
  addr.sun_path[4] = '\0';
  addr.sun_path[5] = '\0';
  auStack_198._0_2_ = 1;
  auStack_198[2] = '\0';
  auStack_198[3] = '\0';
  auStack_198[4] = '\0';
  auStack_198[5] = '\0';
  auStack_198[6] = '\0';
  auStack_198[7] = '\0';
  pcVar6 = (char *)std::__cxx11::string::c_str();
  local_1a0 = 0x6b;
  uStack_1a8 = std::__cxx11::string::size();
  puVar7 = std::min<unsigned_long>(&local_1a0,&stack0xfffffffffffffe58);
  strncpy(auStack_198 + 2,pcVar6,*puVar7);
  local_1ac = connect(local_f0,(sockaddr *)auStack_198,0x6e);
  iVar3 = local_f0;
  if (local_1ac == 0) {
    __buf = (void *)std::__cxx11::string::c_str();
    lVar8 = std::__cxx11::string::size();
    sVar9 = send(iVar3,__buf,lVar8 + 1,0);
    if ((-1 < (int)sVar9) && (lVar8 = std::__cxx11::string::size(), (long)(int)sVar9 == lVar8 + 1))
    {
      std::__cxx11::string::string((string *)(buf + 0x3f8));
      while( true ) {
        sVar9 = recv(local_f0,local_618,0x3ff,0);
        iVar3 = (int)sVar9;
        if (iVar3 < 0) break;
        if (iVar3 == 0) {
          if ((run_together(std::vector<libsbox::Task*,std::allocator<libsbox::Task*>>const&,std::__cxx11::string_const&)
               ::response_validator == '\0') &&
             (iVar3 = __cxa_guard_acquire(&run_together(std::vector<libsbox::Task*,std::allocator<libsbox::Task*>>const&,std::__cxx11::string_const&)
                                           ::response_validator), iVar3 != 0)) {
            SchemaValidator::SchemaValidator(&run_together::response_validator,response_schema_data)
            ;
            __cxa_atexit(SchemaValidator::~SchemaValidator,&run_together::response_validator,
                         &__dso_handle);
            __cxa_guard_release(&run_together(std::vector<libsbox::Task*,std::allocator<libsbox::Task*>>const&,std::__cxx11::string_const&)
                                 ::response_validator);
          }
          SchemaValidator::get_error_abi_cxx11_(&local_658,&run_together::response_validator);
          bVar2 = std::__cxx11::string::empty();
          std::__cxx11::string::~string((string *)&local_658);
          if (((bVar2 ^ 0xff) & 1) != 0) {
            SchemaValidator::get_error_abi_cxx11_
                      ((string *)&document.parseResult_.offset_,&run_together::response_validator);
            Error::Error(__return_storage_ptr__,(string *)&document.parseResult_.offset_);
            std::__cxx11::string::~string((string *)&document.parseResult_.offset_);
            goto LAB_001108b3;
          }
          rapidjson::
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                             *)local_6d8,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                            (CrtAllocator *)0x0);
          str = (Ch *)std::__cxx11::string::c_str();
          this_00 = rapidjson::
                    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                    ::Parse((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                             *)local_6d8,str);
          bVar1 = rapidjson::
                  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::HasParseError(this_00);
          if (bVar1) {
            sVar10 = rapidjson::
                     GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     ::GetErrorOffset((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                                       *)local_6d8);
            parseErrorCode =
                 rapidjson::
                 GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::GetParseError((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                                  *)local_6d8);
            pcVar6 = rapidjson::GetParseError_En(parseErrorCode);
            format_abi_cxx11_(&local_6f8,"Cannot parse response (offset %zi): %s",sVar10,pcVar6);
            Error::Error(__return_storage_ptr__,&local_6f8);
            std::__cxx11::string::~string((string *)&local_6f8);
            goto LAB_00110897;
          }
          bVar1 = SchemaValidator::validate(&run_together::response_validator,(Document *)local_6d8)
          ;
          if (!bVar1) {
            SchemaValidator::get_error_abi_cxx11_(&local_718,&run_together::response_validator);
            Error::Error(__return_storage_ptr__,&local_718);
            std::__cxx11::string::~string((string *)&local_718);
            goto LAB_00110897;
          }
          bVar1 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               *)local_6d8,"error");
          if (bVar1) {
            pGVar14 = rapidjson::
                      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ::operator[]<char_const>
                                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                  *)local_6d8,"error");
            bVar1 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::IsString(pGVar14);
            if (bVar1) {
              pGVar14 = rapidjson::
                        GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ::operator[]<char_const>
                                  ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                    *)local_6d8,"error");
              pCVar11 = rapidjson::
                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ::GetString(pGVar14);
              format_abi_cxx11_((string *)(local_740 + 8),"[remote] %s",pCVar11);
              Error::Error(__return_storage_ptr__,(string *)(local_740 + 8));
              std::__cxx11::string::~string((string *)(local_740 + 8));
              goto LAB_00110897;
            }
          }
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          ::operator[]<char_const>
                    ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      *)local_6d8,"tasks");
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetArray((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_740);
          SVar4 = rapidjson::
                  GenericArray<false,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                  ::Size((GenericArray<false,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                          *)local_740);
          sVar12 = std::vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>::size(tasks);
          rapidjson::
          GenericArray<false,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::~GenericArray((GenericArray<false,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                           *)local_740);
          if (SVar4 != sVar12) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_760,
                       "Response JSON object \'tasks\' array size is not equal to tasks count",
                       (allocator<char> *)((long)&i + 7));
            Error::Error(__return_storage_ptr__,&local_760);
            std::__cxx11::string::~string((string *)&local_760);
            std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
            goto LAB_00110897;
          }
          local_770 = 0;
          goto LAB_00110739;
        }
        local_618[iVar3] = '\0';
        std::__cxx11::string::operator+=((string *)(buf + 0x3f8),local_618);
      }
      format_abi_cxx11_(&local_638,"Cannot receive response: %m");
      Error::Error(__return_storage_ptr__,&local_638);
      std::__cxx11::string::~string((string *)&local_638);
      goto LAB_001108b3;
    }
    format_abi_cxx11_((string *)((long)&res.field_2 + 8),"Cannot send request: %m");
    Error::Error(__return_storage_ptr__,(string *)((long)&res.field_2 + 8));
    std::__cxx11::string::~string((string *)(res.field_2._M_local_buf + 8));
  }
  else {
    format_abi_cxx11_((string *)local_1d0,"Cannot connect to socket: %m");
    Error::Error(__return_storage_ptr__,(string *)local_1d0);
    std::__cxx11::string::~string((string *)local_1d0);
  }
  goto LAB_001108cf;
LAB_00110739:
  sVar12 = std::vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>::size(tasks);
  if (sVar12 <= local_770) goto LAB_0011086e;
  ppTVar13 = std::vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>::operator[]
                       (tasks,local_770);
  this = *ppTVar13;
  pGVar14 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>
                      ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        *)local_6d8,"tasks");
  value = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::operator[](pGVar14,(SizeType)local_770);
  Task::
  deserialize_response<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
            (__return_storage_ptr__,this,value);
  bVar1 = Error::operator_cast_to_bool(__return_storage_ptr__);
  if (bVar1) goto LAB_00110897;
  Error::~Error(__return_storage_ptr__);
  local_770 = local_770 + 1;
  goto LAB_00110739;
LAB_0011086e:
  memset(__return_storage_ptr__,0,0x20);
  Error::Error(__return_storage_ptr__);
LAB_00110897:
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)local_6d8);
LAB_001108b3:
  std::__cxx11::string::~string((string *)(buf + 0x3f8));
LAB_001108cf:
  std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)(addr.sun_path + 0x66));
LAB_001108eb:
  std::__cxx11::string::~string((string *)&socket_fd);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::~Writer((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
             *)local_90);
  rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  ~GenericStringBuffer
            ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
             &writer.maxDecimalPlaces_);
  return __return_storage_ptr__;
}

Assistant:

Error libsbox::run_together(const std::vector<Task *> &tasks, const std::string &socket_path) {
    rapidjson::StringBuffer buffer;
    rapidjson::Writer<rapidjson::StringBuffer> writer(buffer);
    writer.StartObject();
    writer.Key("tasks");
    writer.StartArray();
    for (auto task : tasks) {
        task->serialize_request(writer);
    }
    writer.EndArray();
    writer.EndObject();

    std::string message = buffer.GetString();

    fd_t socket_fd = socket(AF_UNIX, SOCK_STREAM, 0);
    if (socket_fd < 0) {
        return Error(format("Cannot create socket: %m"));
    }

    std::shared_ptr<fd_t> ptr(&socket_fd, [](const fd_t *fd) { close(*fd); });

    sockaddr_un addr{};
    addr.sun_family = AF_UNIX;
    strncpy(addr.sun_path, socket_path.c_str(), std::min(sizeof(addr.sun_path) - 1, socket_path.size()));

    int status = connect(socket_fd, reinterpret_cast<const struct sockaddr *>(&addr), sizeof(struct sockaddr_un));
    if (status != 0) {
        return Error(format("Cannot connect to socket: %m"));
    }

    int cnt = send(socket_fd, message.c_str(), message.size() + 1, 0);
    if (cnt < 0 || static_cast<size_t>(cnt) != message.size() + 1) {
        return Error(format("Cannot send request: %m"));
    }

    std::string res;
    char buf[1024];
    while (true) {
        cnt = recv(socket_fd, buf, 1023, 0);
        if (cnt < 0) {
            return Error(format("Cannot receive response: %m"));
        }
        if (cnt == 0) {
            break;
        }
        buf[cnt] = 0;
        res += buf;
    }

    static SchemaValidator response_validator(response_schema_data);
    if (!response_validator.get_error().empty()) {
        return Error(response_validator.get_error());
    }

    rapidjson::Document document;
    if (document.Parse(res.c_str()).HasParseError()) {
        return Error(
            format(
                "Cannot parse response (offset %zi): %s",
                document.GetErrorOffset(),
                rapidjson::GetParseError_En(document.GetParseError())
            )
        );
    }

    if (!response_validator.validate(document)) {
        return Error(response_validator.get_error());
    }

    if (document.HasMember("error") && document["error"].IsString()) {
        return Error(format("[remote] %s", document["error"].GetString()));
    }

    if (document["tasks"].GetArray().Size() != tasks.size()) {
        return Error("Response JSON object 'tasks' array size is not equal to tasks count");
    }

    for (size_t i = 0; i < tasks.size(); ++i) {
        auto error = tasks[i]->deserialize_response(document["tasks"][i]);
        if (error) {
            return error;
        }
    }

    return Error();
}